

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Bounds3f * __thiscall
pbrt::AnimatedTransform::MotionBounds
          (Bounds3f *__return_storage_ptr__,AnimatedTransform *this,Bounds3f *b)

{
  Point3<float> *pPVar1;
  undefined8 uVar2;
  Bounds3f *pBVar3;
  Bounds3f *pBVar4;
  Bounds3f *pBVar5;
  int corner;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  Bounds3f local_88;
  Bounds3f local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (this->actuallyAnimated == false) {
    Transform::operator()(__return_storage_ptr__,&this->startTransform,b);
  }
  else if (this->hasRotation == false) {
    Transform::operator()(&local_88,&this->startTransform,b);
    Transform::operator()(&local_70,&this->endTransform,b);
    auVar9._8_8_ = 0;
    auVar9._0_4_ = local_70.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    auVar9._4_4_ = local_70.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    auVar12._8_8_ = 0;
    auVar12._0_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    auVar12._4_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    auVar9 = vminps_avx(auVar9,auVar12);
    auVar12 = vminss_avx(ZEXT416((uint)local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z),
                         ZEXT416((uint)local_88.pMin.super_Tuple3<pbrt::Point3,_float>.z));
    uVar2 = vmovlps_avx(auVar9);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    auVar10._8_8_ = 0;
    auVar10._0_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    auVar10._4_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar12._0_4_;
    auVar13._8_8_ = 0;
    auVar13._0_4_ = local_70.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    auVar13._4_4_ = local_70.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    auVar9 = vmaxps_avx(auVar13,auVar10);
    auVar12 = vmaxss_avx(ZEXT416((uint)local_70.pMax.super_Tuple3<pbrt::Point3,_float>.z),
                         ZEXT416((uint)local_88.pMax.super_Tuple3<pbrt::Point3,_float>.z));
    uVar2 = vmovlps_avx(auVar9);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = auVar12._0_4_;
  }
  else {
    local_58._8_4_ = 0x7f7fffff;
    local_58._0_8_ = 0x7f7fffff7f7fffff;
    local_58._12_4_ = 0x7f7fffff;
    local_48._8_4_ = 0xff7fffff;
    local_48._0_8_ = 0xff7fffffff7fffff;
    local_48._12_4_ = 0xff7fffff;
    fVar11 = -3.4028235e+38;
    auVar14 = ZEXT464(0x7f7fffff);
    pPVar1 = &b->pMax;
    uVar6 = 0;
    do {
      pBVar3 = (Bounds3f *)pPVar1;
      if ((uVar6 & 1) == 0) {
        pBVar3 = b;
      }
      pBVar4 = (Bounds3f *)pPVar1;
      if ((uVar6 & 2) == 0) {
        pBVar4 = b;
      }
      pBVar5 = (Bounds3f *)pPVar1;
      if (uVar6 < 4) {
        pBVar5 = b;
      }
      auVar9 = vinsertps_avx(ZEXT416((uint)(pBVar3->pMin).super_Tuple3<pbrt::Point3,_float>.x),
                             ZEXT416((uint)(pBVar4->pMin).super_Tuple3<pbrt::Point3,_float>.y),0x10)
      ;
      local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z =
           (pBVar5->pMin).super_Tuple3<pbrt::Point3,_float>.z;
      local_70.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9);
      BoundPointMotion(&local_88,this,&local_70.pMin);
      auVar7._8_8_ = 0;
      auVar7._0_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      auVar7._4_4_ = local_88.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      uVar6 = uVar6 + 1;
      local_58 = vminps_avx(auVar7,local_58);
      auVar12 = vminss_avx(ZEXT416((uint)local_88.pMin.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416(auVar14._0_4_));
      auVar14 = ZEXT1664(auVar12);
      auVar8._8_8_ = 0;
      auVar8._0_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      auVar8._4_4_ = local_88.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      local_48 = vmaxps_avx(auVar8,local_48);
      auVar9 = vmaxss_avx(ZEXT416((uint)local_88.pMax.super_Tuple3<pbrt::Point3,_float>.z),
                          ZEXT416((uint)fVar11));
      fVar11 = auVar9._0_4_;
    } while (uVar6 != 8);
    uVar2 = vmovlps_avx(local_58);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    uVar2 = vmovlps_avx(local_48);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar12._0_4_;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = fVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

Bounds3f AnimatedTransform::MotionBounds(const Bounds3f &b) const {
    // Handle easy cases for _Bounds3f_ motion bounds
    if (!actuallyAnimated)
        return startTransform(b);
    if (!hasRotation)
        return Union(startTransform(b), endTransform(b));

    // Return motion bounds accounting for animated rotation
    Bounds3f bounds;
    for (int corner = 0; corner < 8; ++corner)
        bounds = Union(bounds, BoundPointMotion(b.Corner(corner)));
    return bounds;
}